

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XInstPrinter.c
# Opt level: O1

void M680X_printInst(MCInst *MI,SStream *O,void *PrinterInfo)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  m680x_reg mVar6;
  m680x_op_rel mVar7;
  cs_detail *pcVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  char *fmt;
  cs_m680x_op *op;
  ulong uVar13;
  bool bVar14;
  
  pcVar8 = MI->flat_insn->detail;
  fmt = ",";
  if ((*(int *)((long)PrinterInfo + 0xf8) != 0x14e) && (1 < *(byte *)((long)PrinterInfo + 0x15))) {
    lVar10 = 0;
    iVar12 = 0;
    bVar14 = false;
    do {
      iVar4 = *(int *)((long)PrinterInfo + lVar10 + 0x18);
      if (iVar4 == 3) {
        bVar14 = true;
      }
      iVar12 = iVar12 + (uint)(iVar4 != 1);
      lVar10 = lVar10 + 0x18;
    } while ((ulong)*(byte *)((long)PrinterInfo + 0x15) * 0x18 != lVar10);
    fmt = ";";
    if (iVar12 == 0) {
      fmt = ",";
    }
    if (!bVar14) {
      fmt = ",";
    }
  }
  if (pcVar8 != (cs_detail *)0x0) {
    memcpy(&pcVar8->field_6,(void *)((long)PrinterInfo + 0x14),0xdc);
  }
  uVar5 = *(uint *)((long)PrinterInfo + 0xf8);
  if ((uVar5 == 0x9f) || (uVar5 == 0)) {
    if (*(char *)((long)PrinterInfo + 0x15) == '\0') {
      SStream_concat(O,"fcb $<unknown>");
      return;
    }
    SStream_concat(O,"fcb $%02X",(ulong)*(uint *)((long)PrinterInfo + 0x1c));
    return;
  }
  pcVar9 = (*MI->csh->insn_name)((csh)MI->csh,uVar5);
  SStream_concat(O,pcVar9);
  SStream_concat(O," ");
  if (*(char *)((long)PrinterInfo + 0x15) != '\0') {
    bVar1 = *(byte *)((long)PrinterInfo + 0x14);
    op = (cs_m680x_op *)((long)PrinterInfo + 0x18);
    uVar13 = 1;
    do {
      if (uVar13 - 1 < (ulong)(bVar1 & 1) + (ulong)((bVar1 >> 1 & 1) != 0)) goto LAB_0026cdfe;
      switch(op->type) {
      case M680X_OP_REGISTER:
        pcVar9 = (*MI->csh->reg_name)((csh)MI->csh,(op->field_1).reg);
        goto LAB_0026cde0;
      case M680X_OP_IMMEDIATE:
        mVar7 = (op->field_1).rel;
        uVar11 = (ulong)(uint)mVar7;
        if (MI->csh->imm_unsigned == CS_OPT_OFF) {
          pcVar9 = "#%d";
        }
        else {
          if (op->size == '\x02') {
            uVar11 = (ulong)mVar7.address;
          }
          else if (op->size == '\x01') {
            uVar11 = (ulong)(byte)mVar7.address;
          }
          pcVar9 = "#%u";
        }
        break;
      case M680X_OP_INDEXED:
        if (((op->field_1).idx.flags & 1) != 0) {
          SStream_concat(O,"[");
        }
        mVar6 = (op->field_1).idx.offset_reg;
        if (mVar6 == M680X_REG_INVALID) {
          if ((op->field_1).idx.offset_bits == '\0') {
            bVar2 = (op->field_1).idx.inc_dec;
            if ((bVar2 != 0) && (*(int *)((long)PrinterInfo + 0x10) == 9)) {
              uVar11 = (ulong)(byte)((bVar2 ^ (char)bVar2 >> 7) - ((char)bVar2 >> 7));
              goto LAB_0026cd45;
            }
          }
          else {
            if ((op->field_1).imm == 0x13) {
              uVar11 = (ulong)(op->field_1).idx.offset_addr;
              pcVar9 = "$%04X";
            }
            else {
              uVar11 = (ulong)(uint)(int)(op->field_1).idx.offset;
LAB_0026cd45:
              pcVar9 = "%d";
            }
            SStream_concat(O,pcVar9,uVar11);
          }
        }
        else {
          pcVar9 = (*MI->csh->reg_name)((csh)MI->csh,mVar6);
          SStream_concat(O,pcVar9);
        }
        if (((op->field_1).idx.flags & 2) == 0) {
          SStream_concat(O,",");
        }
        printIncDec(false,O,(m680x_info *)PrinterInfo,op);
        pcVar9 = (*MI->csh->reg_name)((csh)MI->csh,(op->field_1).reg);
        SStream_concat(O,pcVar9);
        if (((op->field_1).imm == 0x13) && ((op->field_1).idx.offset_bits != '\0')) {
          SStream_concat(O,"R");
        }
        printIncDec(true,O,(m680x_info *)PrinterInfo,op);
        if (((op->field_1).idx.flags & 1) != 0) {
          pcVar9 = "]";
          goto LAB_0026cde0;
        }
        goto LAB_0026cde7;
      case M680X_OP_EXTENDED:
        uVar3 = (op->field_1).rel.address;
        uVar11 = (ulong)uVar3;
        if (*(byte *)((long)&(op->field_1).reg + 2) == 1) {
          pcVar9 = "[$%04X]";
        }
        else {
          if (0xff < uVar3) goto LAB_0026ccae;
          pcVar9 = ">$%04X";
        }
        break;
      case M680X_OP_DIRECT:
        uVar11 = (ulong)(op->field_1).direct_addr;
        pcVar9 = "$%02X";
        break;
      case M680X_OP_RELATIVE:
        uVar11 = (ulong)(op->field_1).rel.address;
LAB_0026ccae:
        pcVar9 = "$%04X";
        break;
      case M680X_OP_CONSTANT:
        uVar11 = (ulong)(op->field_1).direct_addr;
        pcVar9 = "%u";
        break;
      default:
        pcVar9 = "<invalid_operand>";
LAB_0026cde0:
        SStream_concat(O,pcVar9);
        goto LAB_0026cde7;
      }
      SStream_concat(O,pcVar9,uVar11);
LAB_0026cde7:
      if (uVar13 != *(byte *)((long)PrinterInfo + 0x15)) {
        SStream_concat(O,fmt);
      }
LAB_0026cdfe:
      op = op + 1;
      bVar14 = uVar13 < *(byte *)((long)PrinterInfo + 0x15);
      uVar13 = uVar13 + 1;
    } while (bVar14);
  }
  return;
}

Assistant:

void M680X_printInst(MCInst *MI, SStream *O, void *PrinterInfo)
{
	m680x_info *info = (m680x_info *)PrinterInfo;
	cs_m680x *m680x = &info->m680x;
	cs_detail *detail = MI->flat_insn->detail;
	int suppress_operands = 0;
	const char *delimiter = getDelimiter(info, m680x);
	int i;

	if (detail != NULL)
		memcpy(&detail->m680x, m680x, sizeof(cs_m680x));

	if (info->insn == M680X_INS_INVLD || info->insn == M680X_INS_ILLGL) {
		if (m680x->op_count)
			SStream_concat(O, "fcb $%02X", m680x->operands[0].imm);
		else
			SStream_concat(O, "fcb $<unknown>");

		return;
	}

	printInstructionName(MI->csh, O, info->insn);
	SStream_concat(O, " ");

	if ((m680x->flags & M680X_FIRST_OP_IN_MNEM) != 0)
		suppress_operands++;

	if ((m680x->flags & M680X_SECOND_OP_IN_MNEM) != 0)
		suppress_operands++;

	for (i  = 0; i < m680x->op_count; ++i) {
		if (i >= suppress_operands) {
			printOperand(MI, O, info, &m680x->operands[i]);

			if ((i + 1) != m680x->op_count)
				SStream_concat(O, delimiter);
		}
	}
}